

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O1

void __thiscall psy::C::SemanticModelTester::case0005(SemanticModelTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppDVar2;
  Symbol *pSVar3;
  DeclarationCategory DVar4;
  SymbolKind SVar5;
  TypeKind TVar6;
  int iVar7;
  undefined4 extraout_var;
  Lexeme *pLVar9;
  Type *pTVar10;
  undefined4 extraout_var_00;
  ostream *poVar11;
  undefined8 uVar12;
  vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_> syms
  ;
  string local_70;
  vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
  local_50;
  SemanticModel *local_30;
  VariableAndOrFunctionDeclarationSyntax *local_28;
  ObjectDeclarationSymbol *pOVar8;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"x y , z ;","");
  pppDVar2 = &local_50.
              super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50.
  super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pppDVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  compile<psy::C::VariableAndOrFunctionDeclarationSyntax>
            ((SemanticModelTester *)&stack0xffffffffffffffd0,(string *)this,&local_70);
  if (local_50.
      super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)pppDVar2) {
    operator_delete(local_50.
                    super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  SemanticModel::variablesAndOrFunctionsFor(&local_50,local_30,local_28);
  if ((long)local_50.
            super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_50.
            super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x10) {
    pSVar3 = &(*local_50.
                super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_start)->super_Symbol;
    if (pSVar3 == (Symbol *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\t\tExpression is NOT ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"true",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
      poVar11 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                 ,99);
      iVar7 = 0xb2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    }
    else {
      DVar4 = DeclarationSymbol::category((DeclarationSymbol *)pSVar3);
      if (DVar4 == Object) {
        SVar5 = Symbol::kind(pSVar3);
        if (SVar5 == VariableDeclaration) {
          iVar7 = (*pSVar3->_vptr_Symbol[0xd])(pSVar3);
          pOVar8 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var,iVar7);
          pLVar9 = &ObjectDeclarationSymbol::name(pOVar8)->super_Lexeme;
          Lexeme::valueText_abi_cxx11_(&local_70,pLVar9);
          iVar7 = std::__cxx11::string::compare((char *)&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar1) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if (iVar7 == 0) {
            pTVar10 = ObjectDeclarationSymbol::type(pOVar8);
            TVar6 = Type::kind(pTVar10);
            if (TVar6 == Error) {
              pSVar3 = &local_50.
                        super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]->super_Symbol;
              if (pSVar3 == (Symbol *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\t\tExpression is NOT ",0x14);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"true",4);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
                poVar11 = (ostream *)&std::cout;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                           ,99);
                iVar7 = 0xba;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              }
              else {
                DVar4 = DeclarationSymbol::category((DeclarationSymbol *)pSVar3);
                if (DVar4 == Object) {
                  SVar5 = Symbol::kind(pSVar3);
                  if (SVar5 == VariableDeclaration) {
                    iVar7 = (*pSVar3->_vptr_Symbol[0xd])(pSVar3);
                    pOVar8 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var_00,iVar7);
                    pLVar9 = &ObjectDeclarationSymbol::name(pOVar8)->super_Lexeme;
                    Lexeme::valueText_abi_cxx11_(&local_70,pLVar9);
                    iVar7 = std::__cxx11::string::compare((char *)&local_70);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != paVar1) {
                      operator_delete(local_70._M_dataplus._M_p,
                                      local_70.field_2._M_allocated_capacity + 1);
                    }
                    if (iVar7 == 0) {
                      pTVar10 = ObjectDeclarationSymbol::type(pOVar8);
                      TVar6 = Type::kind(pTVar10);
                      if (TVar6 == Error) {
                        if (local_50.
                            super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_50.
                                          super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_50.
                                                super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_50.
                                                super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        return;
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\t\tActual  : ",0xc);
                      pTVar10 = ObjectDeclarationSymbol::type(pOVar8);
                      TVar6 = Type::kind(pTVar10);
                      poVar11 = ::operator<<((ostream *)&std::cout,TVar6);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,"\t\tExpected: ",0xc);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Error",5);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\t",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                 ,99);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
                      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xbf);
                      std::endl<char,std::char_traits<char>>(poVar11);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\t\tActual  : ",0xc);
                      pLVar9 = &ObjectDeclarationSymbol::name(pOVar8)->super_Lexeme;
                      Lexeme::valueText_abi_cxx11_(&local_70,pLVar9);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,local_70._M_dataplus._M_p,
                                           local_70._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,"\t\tExpected: ",0xc);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"z",1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\t",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                 ,99);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
                      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xbe);
                      std::endl<char,std::char_traits<char>>(poVar11);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != paVar1) {
                        operator_delete(local_70._M_dataplus._M_p,
                                        local_70.field_2._M_allocated_capacity + 1);
                      }
                    }
                    uVar12 = __cxa_allocate_exception(1);
                    __cxa_throw(uVar12,&TestFailed::typeinfo,0);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\t\tActual  : ",0xc);
                  SVar5 = Symbol::kind(pSVar3);
                  poVar11 = C::operator<<((ostream *)&std::cout,SVar5);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\tExpected: ",0xc);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,"VariableDeclaration",0x13);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\t",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             ,99);
                  iVar7 = 0xbc;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\t\tActual  : ",0xc);
                  DVar4 = DeclarationSymbol::category((DeclarationSymbol *)pSVar3);
                  poVar11 = C::operator<<((ostream *)&std::cout,DVar4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\tExpected: ",0xc);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Object",6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\t",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             ,99);
                  iVar7 = 0xbb;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
                }
              }
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,iVar7);
              std::endl<char,std::char_traits<char>>(poVar11);
              uVar12 = __cxa_allocate_exception(1);
              __cxa_throw(uVar12,&TestFailed::typeinfo,0);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n!\tFAIL\n",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tActual  : ",0xc);
            pTVar10 = ObjectDeclarationSymbol::type(pOVar8);
            TVar6 = Type::kind(pTVar10);
            poVar11 = ::operator<<((ostream *)&std::cout,TVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\tExpected: ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Error",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\t",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                       ,99);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xb7);
            std::endl<char,std::char_traits<char>>(poVar11);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n!\tFAIL\n",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tActual  : ",0xc);
            pLVar9 = &ObjectDeclarationSymbol::name(pOVar8)->super_Lexeme;
            Lexeme::valueText_abi_cxx11_(&local_70,pLVar9);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_70._M_dataplus._M_p,
                                 local_70._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\tExpected: ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"y",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\t",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                       ,99);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xb6);
            std::endl<char,std::char_traits<char>>(poVar11);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar1) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          uVar12 = __cxa_allocate_exception(1);
          __cxa_throw(uVar12,&TestFailed::typeinfo,0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\t\tActual  : ",0xc);
        SVar5 = Symbol::kind(pSVar3);
        poVar11 = C::operator<<((ostream *)&std::cout,SVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\tExpected: ",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"VariableDeclaration",0x13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\t",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,
                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                   ,99);
        iVar7 = 0xb4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\t\tActual  : ",0xc);
        DVar4 = DeclarationSymbol::category((DeclarationSymbol *)pSVar3);
        poVar11 = C::operator<<((ostream *)&std::cout,DVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\tExpected: ",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Object",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\t",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,
                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                   ,99);
        iVar7 = 0xb3;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
      }
    }
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,iVar7);
    std::endl<char,std::char_traits<char>>(poVar11);
    uVar12 = __cxa_allocate_exception(1);
    __cxa_throw(uVar12,&TestFailed::typeinfo,0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\tExpected: ",0xc);
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,
             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xaf);
  std::endl<char,std::char_traits<char>>(poVar11);
  uVar12 = __cxa_allocate_exception(1);
  __cxa_throw(uVar12,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0005()
{
    auto [varAndOrFunDeclNode, semaModel] =
            compile<VariableAndOrFunctionDeclarationSyntax>("x y , z ;");

    auto syms = semaModel->variablesAndOrFunctionsFor(varAndOrFunDeclNode);
    PSY_EXPECT_EQ_INT(syms.size(), 2);

    const DeclarationSymbol* declSym0 = syms[0];
    PSY_EXPECT_TRUE(declSym0);
    PSY_EXPECT_EQ_ENU(declSym0->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym0->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym1 = declSym0->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym1->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(varDeclSym1->type()->kind(), TypeKind::Error, TypeKind);

    const DeclarationSymbol* declSym1 = syms[1];
    PSY_EXPECT_TRUE(declSym1);
    PSY_EXPECT_EQ_ENU(declSym1->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym1->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym2 = declSym1->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym2->name()->valueText(), "z");
    PSY_EXPECT_EQ_ENU(varDeclSym2->type()->kind(), TypeKind::Error, TypeKind);
}